

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestTestList.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_3402a::TestListAdderAddsTestToList::RunImpl(TestListAdderAddsTestToList *this)

{
  TestResults *pTVar1;
  Test *pTVar2;
  TestResults **ppTVar3;
  TestDetails **ppTVar4;
  ListAdder adder;
  TestList list;
  Test test;
  ListAdder local_79;
  TestDetails local_78;
  TestList local_58;
  Test local_48;
  
  UnitTest::TestList::TestList(&local_58);
  UnitTest::Test::Test(&local_48,"","DefaultSuite","",0);
  UnitTest::ListAdder::ListAdder(&local_79,&local_58,&local_48);
  pTVar2 = UnitTest::TestList::GetHead(&local_58);
  if (pTVar2 != &local_48) {
    ppTVar3 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar3;
    ppTVar4 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&local_78,*ppTVar4,0x2e);
    UnitTest::TestResults::OnTestFailure(pTVar1,&local_78,"list.GetHead() == &test");
  }
  if (local_48.next != (Test *)0x0) {
    ppTVar3 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar3;
    ppTVar4 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&local_78,*ppTVar4,0x2f);
    UnitTest::TestResults::OnTestFailure(pTVar1,&local_78,"test.next == 0");
  }
  UnitTest::Test::~Test(&local_48);
  return;
}

Assistant:

TEST (ListAdderAddsTestToList)
{
    TestList list;

    Test test("");    
    ListAdder adder(list, &test);

    CHECK (list.GetHead() == &test);
    CHECK (test.next == 0);
}